

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O0

CURLMcode curl_multi_fdset(Curl_multi *multi,fd_set *read_fd_set,fd_set *write_fd_set,
                          fd_set *exc_fd_set,int *max_fd)

{
  uint uVar1;
  int local_64;
  int local_60;
  curl_socket_t s;
  int i;
  int bitmap;
  curl_socket_t sockbunch [5];
  int this_max_fd;
  Curl_easy *data;
  int *max_fd_local;
  fd_set *exc_fd_set_local;
  fd_set *write_fd_set_local;
  fd_set *read_fd_set_local;
  Curl_multi *multi_local;
  
  sockbunch[3] = -1;
  if ((multi == (Curl_multi *)0x0) || (multi->type != 0xbab1e)) {
    multi_local._4_4_ = CURLM_BAD_HANDLE;
  }
  else if ((multi->in_callback & 1U) == 0) {
    for (unique0x00012000 = multi->easyp; stack0xffffffffffffffc0 != (Curl_easy *)0x0;
        unique0x00012000 = stack0xffffffffffffffc0->next) {
      uVar1 = multi_getsock(stack0xffffffffffffffc0,&i,5);
      for (local_60 = 0; local_60 < 5; local_60 = local_60 + 1) {
        local_64 = -1;
        if ((((uVar1 & 1 << ((byte)local_60 & 0x1f)) != 0) && (-1 < (&i)[local_60])) &&
           ((&i)[local_60] < 0x400)) {
          read_fd_set->__fds_bits[(&i)[local_60] / 0x40] =
               1L << ((byte)((long)(&i)[local_60] % 0x40) & 0x3f) |
               read_fd_set->__fds_bits[(&i)[local_60] / 0x40];
          local_64 = (&i)[local_60];
        }
        if ((((uVar1 & 1 << ((byte)local_60 + 0x10 & 0x1f)) != 0) && (-1 < (&i)[local_60])) &&
           ((&i)[local_60] < 0x400)) {
          write_fd_set->__fds_bits[(&i)[local_60] / 0x40] =
               1L << ((byte)((long)(&i)[local_60] % 0x40) & 0x3f) |
               write_fd_set->__fds_bits[(&i)[local_60] / 0x40];
          local_64 = (&i)[local_60];
        }
        if (local_64 == -1) break;
        if (sockbunch[3] < local_64) {
          sockbunch[3] = local_64;
        }
      }
    }
    *max_fd = sockbunch[3];
    multi_local._4_4_ = CURLM_OK;
  }
  else {
    multi_local._4_4_ = CURLM_RECURSIVE_API_CALL;
  }
  return multi_local._4_4_;
}

Assistant:

CURLMcode curl_multi_fdset(struct Curl_multi *multi,
                           fd_set *read_fd_set, fd_set *write_fd_set,
                           fd_set *exc_fd_set, int *max_fd)
{
  /* Scan through all the easy handles to get the file descriptors set.
     Some easy handles may not have connected to the remote host yet,
     and then we must make sure that is done. */
  struct Curl_easy *data;
  int this_max_fd = -1;
  curl_socket_t sockbunch[MAX_SOCKSPEREASYHANDLE];
  int bitmap;
  int i;
  (void)exc_fd_set; /* not used */

  if(!GOOD_MULTI_HANDLE(multi))
    return CURLM_BAD_HANDLE;

  if(multi->in_callback)
    return CURLM_RECURSIVE_API_CALL;

  data = multi->easyp;
  while(data) {
    bitmap = multi_getsock(data, sockbunch, MAX_SOCKSPEREASYHANDLE);

    for(i = 0; i< MAX_SOCKSPEREASYHANDLE; i++) {
      curl_socket_t s = CURL_SOCKET_BAD;

      if((bitmap & GETSOCK_READSOCK(i)) && VALID_SOCK((sockbunch[i]))) {
        FD_SET(sockbunch[i], read_fd_set);
        s = sockbunch[i];
      }
      if((bitmap & GETSOCK_WRITESOCK(i)) && VALID_SOCK((sockbunch[i]))) {
        FD_SET(sockbunch[i], write_fd_set);
        s = sockbunch[i];
      }
      if(s == CURL_SOCKET_BAD)
        /* this socket is unused, break out of loop */
        break;
      if((int)s > this_max_fd)
        this_max_fd = (int)s;
    }

    data = data->next; /* check next handle */
  }

  *max_fd = this_max_fd;

  return CURLM_OK;
}